

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<signed_char,_int,_0>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(char *t,int *u,char *result)

{
  int iVar1;
  char cVar2;
  
  iVar1 = *u;
  if (iVar1 == -1) {
    cVar2 = '\0';
  }
  else {
    if (iVar1 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    cVar2 = (char)((int)*t % iVar1);
  }
  *result = cVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }